

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall embree::Image::convertToRGBA8(Image *this,uchar *dest)

{
  long in_RSI;
  long *in_RDI;
  Color4 c;
  size_t offset;
  size_t x;
  size_t y;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  long local_28;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_10 = in_RSI;
  for (local_18 = 0; local_18 < (ulong)in_RDI[3]; local_18 = local_18 + 1) {
    for (local_20 = 0; local_20 < (ulong)in_RDI[2]; local_20 = local_20 + 1) {
      local_28 = (local_18 * in_RDI[2] + local_20) * 4;
      (**(code **)(*in_RDI + 0x20))(&local_38,in_RDI,local_20,local_18);
      *(char *)(local_10 + local_28) = (char)(int)(local_38 * 255.0);
      *(char *)(local_28 + 1 + local_10) = (char)(int)(local_34 * 255.0);
      *(char *)(local_28 + 2 + local_10) = (char)(int)(local_30 * 255.0);
      *(char *)(local_10 + 3 + local_28) = (char)(int)(local_2c * 255.0);
    }
  }
  return;
}

Assistant:

void convertToRGBA8(unsigned char *dest)
    {
      for (size_t y=0;y<height;y++)
	for (size_t x=0;x<width;x++)
	  {
	    size_t offset = 4 * (y * width + x);
	    Color4 c = get(x,y);
	    dest[offset+0] = (unsigned char)(c.r * 255.0f);
	    dest[offset+1] = (unsigned char)(c.g * 255.0f);
	    dest[offset+2] = (unsigned char)(c.b * 255.0f);
	    dest[offset+3] = (unsigned char)(c.a * 255.0f);
	  }
    }